

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O0

xmlDtdPtr xmlGetIntSubset(xmlDoc *doc)

{
  xmlDtdPtr local_20;
  xmlNodePtr cur;
  xmlDoc *doc_local;
  
  if (doc == (xmlDoc *)0x0) {
    doc_local = (xmlDoc *)0x0;
  }
  else {
    for (local_20 = (xmlDtdPtr)doc->children; local_20 != (xmlDtdPtr)0x0;
        local_20 = (xmlDtdPtr)local_20->next) {
      if (local_20->type == XML_DTD_NODE) {
        return local_20;
      }
    }
    doc_local = (xmlDoc *)doc->intSubset;
  }
  return (xmlDtdPtr)doc_local;
}

Assistant:

xmlDtdPtr
xmlGetIntSubset(const xmlDoc *doc) {
    xmlNodePtr cur;

    if (doc == NULL)
	return(NULL);
    cur = doc->children;
    while (cur != NULL) {
	if (cur->type == XML_DTD_NODE)
	    return((xmlDtdPtr) cur);
	cur = cur->next;
    }
    return((xmlDtdPtr) doc->intSubset);
}